

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O2

void uv__inotify_read(uv_loop_t *loop,uv__io_t *dummy,uint events)

{
  uint uVar1;
  int *__s;
  uv__queue *puVar2;
  uv__queue *puVar3;
  uv__queue *puVar4;
  ssize_t sVar5;
  watcher_list *w;
  char *pcVar6;
  int *piVar7;
  int *piVar8;
  uv__queue *puVar9;
  uv__queue queue;
  char buf [4096];
  
  do {
    while (sVar5 = read(loop->inotify_fd,buf,0x1000), sVar5 != -1) {
      if (sVar5 < 1) {
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                      ,0x9a5,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
      }
      for (piVar7 = (int *)buf; piVar7 < buf + sVar5;
          piVar7 = (int *)((long)piVar7 + (ulong)(uint)piVar7[3] + 0x10)) {
        uVar1 = piVar7[1];
        w = find_watcher(loop,*piVar7);
        if (w != (watcher_list *)0x0) {
          if (piVar7[3] == 0) {
            __s = (int *)w->path;
            pcVar6 = strrchr((char *)__s,0x2f);
            piVar8 = (int *)(pcVar6 + 1);
            if (pcVar6 == (char *)0x0) {
              piVar8 = __s;
            }
          }
          else {
            piVar8 = piVar7 + 4;
          }
          w->iterating = 1;
          puVar9 = &w->watchers;
          puVar2 = (w->watchers).next;
          queue.next = &queue;
          if (puVar2 != puVar9) {
            queue.prev = (w->watchers).prev;
            (queue.prev)->next = &queue;
            puVar3 = puVar2->prev;
            (w->watchers).prev = puVar3;
            puVar3->next = puVar9;
            queue.next = puVar2;
          }
          (queue.next)->prev = &queue;
          while (puVar2 = queue.next, queue.next != &queue) {
            puVar3 = queue.next + -5;
            puVar4 = (queue.next)->next;
            (queue.next)->prev->next = puVar4;
            puVar4->prev = (queue.next)->prev;
            (queue.next)->next = puVar9;
            puVar4 = (w->watchers).prev;
            puVar2->prev = puVar4;
            puVar4->next = puVar2;
            (w->watchers).prev = puVar2;
            (*(code *)puVar2[-1].prev)
                      (puVar3,piVar8,((uVar1 & 0xfffffff9) != 0) + ((uVar1 & 6) != 0) * '\x02',0);
          }
          w->iterating = 0;
          maybe_free_watcher_list(w,loop);
        }
      }
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  if (*piVar7 != 0xb) {
    __assert_fail("errno == EAGAIN || errno == EWOULDBLOCK",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/src/unix/linux.c"
                  ,0x9a1,"void uv__inotify_read(uv_loop_t *, uv__io_t *, unsigned int)");
  }
  return;
}

Assistant:

static void uv__inotify_read(uv_loop_t* loop,
                             uv__io_t* dummy,
                             unsigned int events) {
  const struct inotify_event* e;
  struct watcher_list* w;
  uv_fs_event_t* h;
  struct uv__queue queue;
  struct uv__queue* q;
  const char* path;
  ssize_t size;
  const char *p;
  /* needs to be large enough for sizeof(inotify_event) + strlen(path) */
  char buf[4096];

  for (;;) {
    do
      size = read(loop->inotify_fd, buf, sizeof(buf));
    while (size == -1 && errno == EINTR);

    if (size == -1) {
      assert(errno == EAGAIN || errno == EWOULDBLOCK);
      break;
    }

    assert(size > 0); /* pre-2.6.21 thing, size=0 == read buffer too small */

    /* Now we have one or more inotify_event structs. */
    for (p = buf; p < buf + size; p += sizeof(*e) + e->len) {
      e = (const struct inotify_event*) p;

      events = 0;
      if (e->mask & (IN_ATTRIB|IN_MODIFY))
        events |= UV_CHANGE;
      if (e->mask & ~(IN_ATTRIB|IN_MODIFY))
        events |= UV_RENAME;

      w = find_watcher(loop, e->wd);
      if (w == NULL)
        continue; /* Stale event, no watchers left. */

      /* inotify does not return the filename when monitoring a single file
       * for modifications. Repurpose the filename for API compatibility.
       * I'm not convinced this is a good thing, maybe it should go.
       */
      path = e->len ? (const char*) (e + 1) : uv__basename_r(w->path);

      /* We're about to iterate over the queue and call user's callbacks.
       * What can go wrong?
       * A callback could call uv_fs_event_stop()
       * and the queue can change under our feet.
       * So, we use uv__queue_move() trick to safely iterate over the queue.
       * And we don't free the watcher_list until we're done iterating.
       *
       * First,
       * tell uv_fs_event_stop() (that could be called from a user's callback)
       * not to free watcher_list.
       */
      w->iterating = 1;
      uv__queue_move(&w->watchers, &queue);
      while (!uv__queue_empty(&queue)) {
        q = uv__queue_head(&queue);
        h = uv__queue_data(q, uv_fs_event_t, watchers);

        uv__queue_remove(q);
        uv__queue_insert_tail(&w->watchers, q);

        h->cb(h, path, events, 0);
      }
      /* done iterating, time to (maybe) free empty watcher_list */
      w->iterating = 0;
      maybe_free_watcher_list(w, loop);
    }
  }
}